

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGeometry.h
# Opt level: O2

ChMatrix33<double> *
chrono::utils::CalcBiSphereGyration
          (ChMatrix33<double> *__return_storage_ptr__,double radius,double cDist,
          ChVector<double> *pos,ChQuaternion<double> *rot)

{
  double dVar1;
  undefined1 auVar4 [16];
  double dVar2;
  double dVar3;
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar6._8_56_ = in_register_00001248;
  auVar6._0_8_ = cDist;
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = radius;
  auVar8 = vfmsub231sd_fma(auVar6._0_16_,auVar5._0_16_,ZEXT816(0x4000000000000000));
  auVar8 = vfmadd132sd_fma(auVar8,auVar5._0_16_,ZEXT816(0xbfe0000000000000));
  dVar3 = auVar8._0_8_;
  auVar4._0_8_ = dVar3 / radius;
  auVar4._8_8_ = auVar8._8_8_;
  dVar1 = auVar4._0_8_ + 1.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar4._0_8_ * auVar4._0_8_;
  auVar8 = vfnmadd213sd_fma(auVar8,auVar4,ZEXT816(0xbff0000000000000));
  auVar4 = vfnmadd213sd_fma(auVar4,auVar4,ZEXT816(0x3ff0000000000000));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar8 = vfmadd132sd_fma(auVar8,auVar7,ZEXT816(0x3fd5555555555555));
  if (auVar4._0_8_ < 0.0) {
    dVar2 = sqrt(auVar4._0_8_);
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar2 = auVar4._0_8_;
  }
  dVar3 = dVar3 * dVar3 * 0.6666666666666666 * dVar1 +
          (radius * 0.4 * radius * dVar1 - radius * 0.2 * radius * auVar8._0_8_) +
          radius * 0.5 * dVar3 * dVar2;
  dVar3 = (dVar3 + dVar3) / (dVar1 * 1.3333333333333333);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)__return_storage_ptr__);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar3;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (radius * 0.6 * radius * auVar8._0_8_) / dVar1;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

inline ChMatrix33<> CalcBiSphereGyration(double radius,
                                         double cDist,
                                         const ChVector<>& pos = ChVector<>(0, 0, 0),
                                         const ChQuaternion<>& rot = ChQuaternion<>(1, 0, 0, 0)) {
    // TODO: simple implementation for now

    double delta = 2 * radius - cDist;
    double cos_theta = (radius - 0.5 * delta) / radius;
    double z_prim = radius - 0.5 * delta;

    double comp1 = 0.4 * radius * radius * (1 + cos_theta);
    double comp2 = -0.2 * radius * radius * (1. / 3. * (-cos_theta * cos_theta * cos_theta - 1) + (1 + cos_theta));
    double comp3 = 2. / 3. * z_prim * z_prim * (1 + cos_theta);
    double comp4 = 0.5 * radius * z_prim * sqrt(1 - cos_theta * cos_theta);
    double numerator = 2 * (comp1 + comp2 + comp3 + comp4);
    double denominator = 4. / 3. * (1 + cos_theta);
    double Jxx = numerator / denominator;
    double Jyy = 0.6 * radius * radius * (1. / 3. * (-cos_theta * cos_theta * cos_theta - 1) + (1 + cos_theta)) /
                 (1 + cos_theta);

    ChMatrix33<> J;
    J.setZero();
    J(0, 0) = Jxx;
    J(1, 1) = Jyy;
    J(2, 2) = Jxx;

    TransformGyration(J, pos, rot);

    return J;
}